

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.cc
# Opt level: O1

void CoreML::Specification::CoreMLModels::protobuf_SoundAnalysisPreprocessing_2eproto::TableStruct::
     InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/SoundAnalysisPreprocessing.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  SoundAnalysisPreprocessing_Vggish::SoundAnalysisPreprocessing_Vggish
            ((SoundAnalysisPreprocessing_Vggish *)
             &_SoundAnalysisPreprocessing_Vggish_default_instance_);
  DAT_003e3560 = 1;
  SoundAnalysisPreprocessing::SoundAnalysisPreprocessing
            ((SoundAnalysisPreprocessing *)&_SoundAnalysisPreprocessing_default_instance_);
  DAT_003e3588 = 1;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _SoundAnalysisPreprocessing_Vggish_default_instance_.DefaultConstruct();
  _SoundAnalysisPreprocessing_default_instance_.DefaultConstruct();
}